

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> * __thiscall
Catch::splitStringRef
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          Catch *this,StringRef str,char delimiter)

{
  ulong uVar1;
  size_t sVar2;
  size_t start_00;
  char cVar3;
  size_type sVar4;
  StringRef local_68 [2];
  StringRef local_48;
  ulong local_38;
  size_t pos;
  size_t start;
  undefined1 auStack_20 [7];
  char delimiter_local;
  StringRef str_local;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *subStrings;
  
  str_local.m_start = str.m_start;
  start._7_1_ = (char)str.m_size;
  start._6_1_ = 0;
  _auStack_20 = this;
  str_local.m_size = (size_type)__return_storage_ptr__;
  std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::vector(__return_storage_ptr__);
  pos = 0;
  for (local_38 = 0; uVar1 = local_38, sVar4 = StringRef::size((StringRef *)auStack_20), sVar2 = pos
      , uVar1 < sVar4; local_38 = local_38 + 1) {
    cVar3 = StringRef::operator[]((StringRef *)auStack_20,local_38);
    if (cVar3 == start._7_1_) {
      if (1 < local_38 - pos) {
        local_48 = StringRef::substr((StringRef *)auStack_20,pos,local_38 - pos);
        std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::push_back
                  (__return_storage_ptr__,&local_48);
      }
      pos = local_38 + 1;
    }
  }
  sVar4 = StringRef::size((StringRef *)auStack_20);
  start_00 = pos;
  if (sVar2 < sVar4) {
    sVar4 = StringRef::size((StringRef *)auStack_20);
    local_68[0] = StringRef::substr((StringRef *)auStack_20,start_00,sVar4 - pos);
    std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::push_back
              (__return_storage_ptr__,local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> splitStringRef( StringRef str, char delimiter ) {
        std::vector<StringRef> subStrings;
        std::size_t start = 0;
        for(std::size_t pos = 0; pos < str.size(); ++pos ) {
            if( str[pos] == delimiter ) {
                if( pos - start > 1 )
                    subStrings.push_back( str.substr( start, pos-start ) );
                start = pos+1;
            }
        }
        if( start < str.size() )
            subStrings.push_back( str.substr( start, str.size()-start ) );
        return subStrings;
    }